

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void StatInit(SuperLUStat_t *stat)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  flops_t *pfVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  char msg [256];
  
  iVar1 = sp_ienv(1);
  iVar2 = sp_ienv(2);
  if (iVar1 <= iVar2) {
    iVar1 = iVar2;
  }
  piVar3 = int32Calloc(iVar1 + 1);
  stat->panel_histo = piVar3;
  pdVar4 = (double *)superlu_malloc(0xb0);
  stat->utime = pdVar4;
  if (pdVar4 == (double *)0x0) {
    pcVar8 = "SUPERLU_MALLOC fails for stat->utime";
    uVar6 = 0x172;
  }
  else {
    pfVar5 = (flops_t *)superlu_malloc(0x58);
    stat->ops = pfVar5;
    if (pfVar5 != (flops_t *)0x0) {
      pdVar4 = stat->utime;
      for (lVar7 = 0; lVar7 != 0x16; lVar7 = lVar7 + 1) {
        pdVar4[lVar7] = 0.0;
        pfVar5[lVar7] = 0.0;
      }
      stat->TinyPivots = 0;
      stat->RefineSteps = 0;
      stat->expansions = 0;
      return;
    }
    pcVar8 = "SUPERLU_MALLOC fails for stat->ops";
    uVar6 = 0x174;
  }
  sprintf(msg,"%s at line %d in file %s\n",pcVar8,uVar6,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/util.c");
  superlu_abort_and_exit(msg);
}

Assistant:

void
StatInit(SuperLUStat_t *stat)
{
    register int i, w, panel_size, relax;

    panel_size = sp_ienv(1);
    relax = sp_ienv(2);
    w = SUPERLU_MAX(panel_size, relax);
    stat->panel_histo = int32Calloc(w+1);
    stat->utime = (double *) SUPERLU_MALLOC(NPHASES * sizeof(double));
    if (!stat->utime) ABORT("SUPERLU_MALLOC fails for stat->utime");
    stat->ops = (flops_t *) SUPERLU_MALLOC(NPHASES * sizeof(flops_t));
    if (!stat->ops) ABORT("SUPERLU_MALLOC fails for stat->ops");
    for (i = 0; i < NPHASES; ++i) {
        stat->utime[i] = 0.;
        stat->ops[i] = 0.;
    }
    stat->TinyPivots = 0;
    stat->RefineSteps = 0;
    stat->expansions = 0;
#if ( PRNTlevel >= 1 )
    printf(".. parameters in sp_ienv():\n");
    printf("\t 1: panel size \t %4d \n"
           "\t 2: relax      \t %4d \n"
           "\t 3: max. super \t %4d \n"
           "\t 4: row-dim 2D \t %4d \n"
           "\t 5: col-dim 2D \t %4d \n"
           "\t 6: fill ratio \t %4d \n",
	   sp_ienv(1), sp_ienv(2), sp_ienv(3), 
	   sp_ienv(4), sp_ienv(5), sp_ienv(6));
#endif
}